

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.hpp
# Opt level: O2

string * __thiscall
bredis::bredis_category::message_abi_cxx11_
          (string *__return_storage_ptr__,bredis_category *this,int ev)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_e;
  allocator local_d;
  allocator local_c;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  switch(ev) {
  case 1:
    pcVar2 = "Wrong introduction";
    paVar1 = &local_9;
    break;
  case 2:
    pcVar2 = "Parser error";
    paVar1 = &local_a;
    break;
  case 3:
    pcVar2 = "Cannot convert count to number";
    paVar1 = &local_b;
    break;
  case 4:
    pcVar2 = "Unacceptable count value";
    paVar1 = &local_c;
    break;
  case 5:
    pcVar2 = "Terminator for bulk string not found";
    paVar1 = &local_d;
    break;
  default:
    pcVar2 = "Unknown protocol error";
    paVar1 = &local_e;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string message(int ev) const {
        auto ec = static_cast<bredis_errors>(ev);
        switch (ec) {
        case bredis_errors::wrong_intoduction:
            return "Wrong introduction";
        case bredis_errors::parser_error:
            return "Parser error";
        case bredis_errors::count_conversion:
            return "Cannot convert count to number";
        case bredis_errors::count_range:
            return "Unacceptable count value";
        case bredis_errors::bulk_terminator:
            return "Terminator for bulk string not found";
        }
        return "Unknown protocol error";
    }